

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcoflow.c
# Opt level: O2

DLword gcmaptable(DLword arg)

{
  int *piVar1;
  DLword *pDVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  long lVar8;
  
  uVar4 = *MaxTypeNumber_word;
  puVar7 = HToverflow;
  if ((uVar4 & 0xfff0000) == 0xf0000) {
    uVar4 = uVar4 | 0xffff0000;
  }
  else if ((uVar4 & 0xfff0000) == 0xe0000) {
    uVar4 = uVar4 & 0xffff;
  }
  else {
    error("Not smallp address");
    uVar4 = 0;
    puVar7 = HToverflow;
  }
  while( true ) {
    uVar5 = *puVar7 & 0xfffffff;
    if (uVar5 == 0) break;
    if ((-1 < *(short *)((ulong)(uVar5 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(uVar5,*puVar7 >> 0x1c);
    }
    *puVar7 = 0;
    puVar7 = puVar7 + 1;
  }
  lVar6 = 0x2a;
  for (lVar8 = 1; pDVar2 = DTDspace, lVar8 <= (int)uVar4; lVar8 = lVar8 + 1) {
    if (*(ushort *)((long)DTDspace + lVar6) != 0) {
      piVar1 = (int *)((long)DTDspace + lVar6 + 0x12);
      uVar3 = (uint)*(ushort *)((long)DTDspace + lVar6);
      *piVar1 = *piVar1 + uVar3;
      *(undefined2 *)((long)pDVar2 + lVar6) = 0;
      uVar5 = *Reclaim_cnt_word;
      if (uVar5 != 0) {
        if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
          *Reclaim_cnt_word = 0;
          doreclaim();
        }
        else {
          *Reclaim_cnt_word = uVar5 - uVar3;
        }
      }
    }
    lVar6 = lVar6 + 0x24;
  }
  return arg;
}

Assistant:

DLword gcmaptable(DLword arg) {
  struct htoverflow *cell;
  struct dtd *ptr;
  LispPTR cellcnt;
  int typnum;
  LispPTR addr;
  int maxtypenumber = GetSmalldata(*MaxTypeNumber_word);

  cell = (struct htoverflow *)HToverflow;
  /* This proc. protected from interrupt */
  while ((addr = cell->ptr) != NIL) {
    REC_GCLOOKUP(addr, cell->pcase);
    cell->ptr = 0;
    cell->pcase = 0;
    ++cell; /* (\ADDBASE CELL WORDSPERCELL) */
  }
  for (typnum = 1; typnum <= maxtypenumber; ++typnum)
  /* applied alltype */
  {
    ptr = (struct dtd *)GetDTD(typnum);
    if ((cellcnt = ptr->dtd_cnt0) != 0) {
      ptr->dtd_oldcnt += cellcnt;
      ptr->dtd_cnt0 = 0;
      Increment_Allocation_Count(cellcnt);
    }
  }
  return (arg);
}